

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  uint64_t *puVar1;
  ulong *puVar2;
  uint uVar3;
  vec<unsigned_int> *pvVar4;
  uint64_t uVar5;
  uint *puVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  undefined7 in_register_00000031;
  ulong uVar19;
  uint *puVar20;
  ulong uVar21;
  ulong uVar22;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this_00;
  bool bVar23;
  Var best;
  int local_80;
  uint local_7c;
  ulong local_78;
  uint local_6c;
  uint local_68;
  int local_64;
  uint *local_60;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *local_58;
  Queue<unsigned_int> *local_50;
  ulong *local_48;
  uint *local_40;
  uint *local_38;
  int iVar10;
  
  local_7c = (uint)CONCAT71(in_register_00000031,verbose);
  uVar16 = CONCAT71(in_register_00000031,verbose) & 0xffffffff;
  local_50 = &this->subsumption_queue;
  this_00 = &this->occurs;
  local_68 = 0;
  local_6c = 0;
  local_64 = 0;
  local_58 = this_00;
  do {
    iVar9 = (this->subsumption_queue).end;
    iVar10 = 0;
    iVar15 = (this->subsumption_queue).first;
    iVar12 = iVar9 - iVar15;
    if (iVar9 < iVar15) {
      iVar10 = (this->subsumption_queue).buf.sz;
    }
    iVar9 = iVar10 + iVar12;
    if ((iVar9 == 0 || SCARRY4(iVar10,iVar12) != iVar9 < 0) &&
       ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
      return true;
    }
    if (((this->super_Solver).asynch_interrupt != false) ||
       ((this->max_simp_steps != 0xffffffffffffffff &&
        ((ulong)this->max_simp_steps <= (this->super_Solver).statistics.simpSteps)))) {
      if ((local_50->buf).data != (uint *)0x0) {
        (this->subsumption_queue).buf.sz = 0;
      }
      vec<unsigned_int>::growTo(&local_50->buf,1);
      (this->subsumption_queue).first = 0;
      (this->subsumption_queue).end = 0;
      this->bwdsub_assigns = (this->super_Solver).trail.sz;
      return true;
    }
    if (iVar9 == 0) {
      iVar9 = this->bwdsub_assigns;
      if (iVar9 < (this->super_Solver).trail.sz) {
        this->bwdsub_assigns = iVar9 + 1;
        puVar20 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        puVar20[(ulong)this->bwdsub_tmpunit + 2] = (this->super_Solver).trail.data[iVar9].x;
        puVar2 = (ulong *)(puVar20 + this->bwdsub_tmpunit);
        uVar13 = *puVar2 >> 0x22;
        uVar14 = 0;
        if (0x3ffffffff < *puVar2) {
          uVar19 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 | 1 << (*(byte *)((long)puVar2 + uVar19 * 4 + 8) >> 1 & 0x1f);
            uVar19 = uVar19 + 1;
          } while (uVar13 != uVar19);
        }
        *(uint *)((long)puVar2 + uVar13 * 4 + 8) = uVar14;
        Queue<unsigned_int>::insert(local_50,this->bwdsub_tmpunit);
        puVar1 = &(this->super_Solver).statistics.simpSteps;
        *puVar1 = *puVar1 + 1;
      }
    }
    iVar9 = (this->subsumption_queue).first;
    iVar15 = iVar9 + 1;
    uVar13 = (ulong)(this->subsumption_queue).buf.data[iVar9];
    if (iVar15 == (this->subsumption_queue).buf.sz) {
      iVar15 = 0;
    }
    (this->subsumption_queue).first = iVar15;
    puVar20 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
    puVar1 = &(this->super_Solver).statistics.simpSteps;
    *puVar1 = *puVar1 + 1;
    bVar23 = false;
    if ((*(ulong *)(puVar20 + uVar13) & 3) == 0) {
      puVar2 = (ulong *)(puVar20 + uVar13);
      *puVar2 = *(ulong *)(puVar20 + uVar13) & 0xfffffffdfffffffc;
      local_78 = uVar13;
      if ((((char)uVar16 != '\0') && (1 < (this->super_Solver).verbosity)) &&
         (iVar9 = local_64 * 0x26e978d5, iVar15 = local_64 + 1, uVar14 = local_64 * -0x60000000,
         local_64 = iVar15, (iVar9 + 0x10624d8U >> 3 | uVar14) < 0x418937)) {
        iVar9 = (this->subsumption_queue).end;
        iVar10 = 0;
        iVar15 = (this->subsumption_queue).first;
        if (iVar9 < iVar15) {
          iVar10 = (this->subsumption_queue).buf.sz;
        }
        printf("c subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
               (ulong)(uint)((iVar9 - iVar15) + iVar10),(ulong)local_6c,(ulong)local_68);
      }
      iVar9 = (int)puVar2[1] >> 1;
      local_80 = iVar9;
      if (*puVar2 >> 0x23 != 0) {
        pvVar4 = (this->occurs).occs.data;
        uVar13 = 1;
        do {
          iVar15 = (int)puVar20[local_78 + uVar13 + 2] >> 1;
          if (pvVar4[iVar15].sz < pvVar4[iVar9].sz) {
            iVar9 = iVar15;
            local_80 = iVar15;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < *puVar2 >> 0x22);
      }
      if ((this->occurs).dirty.data[local_80] != '\0') {
        OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clean
                  (this_00,&local_80);
      }
      lVar11 = (long)local_80;
      pvVar4 = (this_00->occs).data;
      if (0 < pvVar4[lVar11].sz) {
        local_48 = puVar2 + 1;
        puVar20 = pvVar4[lVar11].data;
        iVar9 = 0;
        uVar16 = local_78;
        local_60 = puVar20;
        do {
          if ((*puVar2 & 3) != 0) break;
          uVar5 = (this->super_Solver).statistics.simpSteps;
          (this->super_Solver).statistics.simpSteps = uVar5 + 1;
          if (uVar5 != 0) {
            uVar14 = puVar20[iVar9];
            if (uVar14 != (uint)uVar16) {
              puVar6 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
              uVar13 = *(ulong *)(puVar6 + uVar14);
              if ((uVar13 & 3) == 0) {
                uVar19 = uVar13 >> 0x22;
                if ((this->subsumption_lim == -1) ||
                   ((int)(uint)(uVar13 >> 0x22) < this->subsumption_lim)) {
                  uVar16 = *puVar2 >> 0x22;
                  if ((uVar19 < uVar16) ||
                     ((*(uint *)((long)local_48 + uVar16 * 4) & ~puVar6[(ulong)uVar14 + uVar19 + 2])
                      != 0)) {
LAB_00129050:
                    uVar17 = 0xffffffff;
                  }
                  else {
                    uVar17 = 0xfffffffe;
                    if (0x3ffffffff < *puVar2) {
                      local_40 = puVar6 + (ulong)uVar14 + 2;
                      local_38 = puVar6 + (ulong)uVar14 + 3;
                      uVar22 = 0;
                      uVar17 = 0xfffffffe;
                      do {
                        uVar18 = uVar17;
                        bVar23 = 0x3ffffffff < uVar13;
                        if (0x3ffffffff < uVar13) {
                          uVar3 = *(uint *)((long)local_48 + uVar22 * 4);
                          bVar23 = true;
                          if ((uVar3 != *local_40) &&
                             ((uVar17 != 0xfffffffe || (uVar18 = uVar3, (*local_40 ^ uVar3) != 1))))
                          {
                            uVar7 = 1;
                            do {
                              uVar21 = uVar7;
                              uVar18 = uVar17;
                              if ((uVar19 == uVar21) ||
                                 (uVar3 == puVar6[(ulong)uVar14 + uVar21 + 2])) break;
                              uVar7 = uVar21 + 1;
                            } while ((uVar17 != 0xfffffffe) ||
                                    (uVar18 = uVar3,
                                    (puVar6[(ulong)uVar14 + uVar21 + 2] ^ uVar3) != 1));
                            bVar23 = uVar21 < uVar19;
                          }
                        }
                        uVar17 = uVar18;
                        if (!bVar23) goto LAB_00129050;
                        uVar22 = uVar22 + 1;
                      } while (uVar22 != uVar16);
                    }
                  }
                  bVar23 = true;
                  if (uVar17 != 0xffffffff) {
                    if (uVar17 == 0xfffffffe) {
                      local_6c = local_6c + 1;
                      removeClause(this,uVar14);
                    }
                    else {
                      local_68 = local_68 + 1;
                      bVar8 = strengthenClause(this,uVar14,(Lit)(uVar17 ^ 1));
                      if (bVar8) {
                        iVar9 = iVar9 - (uint)((int)uVar17 >> 1 == local_80);
                      }
                      else {
                        bVar23 = false;
                      }
                    }
                  }
                  puVar20 = local_60;
                  uVar16 = local_78;
                  if (!bVar23) {
                    bVar23 = true;
                    uVar16 = (ulong)local_7c;
                    this_00 = local_58;
                    goto LAB_0012919a;
                  }
                }
              }
            }
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < pvVar4[lVar11].sz);
        uVar16 = (ulong)local_7c;
        this_00 = local_58;
      }
      bVar23 = false;
    }
LAB_0012919a:
    if (bVar23) {
      return false;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()) {

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt || !isInSimpLimit()) {
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break;
        }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()) {
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit);
            statistics.simpSteps++;
        }

        CRef cr = subsumption_queue.peek();
        subsumption_queue.pop();
        Clause &c = ca[cr];
        statistics.simpSteps++;

        if (c.mark()) continue;

        c.setOnQueue(false);

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("c subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(),
                   subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True); // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size()) best = var(c[i]);

        // Search all candidates:
        vec<CRef> &_cs = occurs.lookup(best);
        CRef *cs = (CRef *)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (statistics.simpSteps++ && !ca[cs[j]].mark() && cs[j] != cr &&
                     (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)) {
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error) {
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l)) return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best) j--;
                }
            }
    }

    return true;
}